

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<256,_256>::CollectUnmarked(ObjectBlockPool<256,_256> *this)

{
  uint local_48;
  SmallBlock<256> *local_38;
  SmallBlock<256> *local_30;
  Block *local_28;
  markerType *marker;
  MyLargeBlock *pMStack_18;
  uint i;
  MyLargeBlock *curr;
  ObjectBlockPool<256,_256> *this_local;
  
  curr = (MyLargeBlock *)this;
  for (pMStack_18 = this->activePages; pMStack_18 != (MyLargeBlock *)0x0;
      pMStack_18 = pMStack_18->next) {
    marker._4_4_ = 0;
    while( true ) {
      if (pMStack_18 == this->activePages) {
        local_48 = this->lastNum;
      }
      else {
        local_48 = 0x100;
      }
      if (local_48 <= marker._4_4_) break;
      local_28 = pMStack_18->page + marker._4_4_;
      if ((local_28->marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)) == 0) {
        if (((local_28->marker & NULLC::OBJECT_FINALIZABLE) == 0) ||
           ((local_28->marker & NULLC::OBJECT_FINALIZED) != 0)) {
          local_38 = pMStack_18->page + marker._4_4_;
          FastVector<SmallBlock<256>_*,_false,_false>::push_back(&this->objectsToFree,&local_38);
        }
        else {
          local_30 = pMStack_18->page + marker._4_4_;
          FastVector<SmallBlock<256>_*,_false,_false>::push_back(&this->objectsToFinalize,&local_30)
          ;
        }
      }
      marker._4_4_ = marker._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}